

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

void __thiscall testing::internal::UnitTestImpl::~UnitTestImpl(UnitTestImpl *this)

{
  pointer ppTVar1;
  pointer ppEVar2;
  DeathTestFactory *pDVar3;
  pointer piVar4;
  pointer pcVar5;
  pointer ppTVar6;
  pointer ppEVar7;
  
  this->_vptr_UnitTestImpl = (_func_int **)&PTR__UnitTestImpl_00174620;
  ppTVar1 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppTVar6 = (this->test_cases_).
                 super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>.
                 _M_impl.super__Vector_impl_data._M_start; ppTVar6 != ppTVar1; ppTVar6 = ppTVar6 + 1
      ) {
    if (*ppTVar6 != (TestCase *)0x0) {
      (*(*ppTVar6)->_vptr_TestCase[1])();
    }
  }
  ppEVar2 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  for (ppEVar7 = (this->environments_).
                 super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppEVar7 != ppEVar2;
      ppEVar7 = ppEVar7 + 1) {
    if (*ppEVar7 != (Environment *)0x0) {
      (**(code **)(*(long *)*ppEVar7 + 8))();
    }
  }
  if (this->os_stack_trace_getter_ != (OsStackTraceGetterInterface *)0x0) {
    (*this->os_stack_trace_getter_->_vptr_OsStackTraceGetterInterface[1])();
  }
  ThreadLocal<std::vector<testing::internal::TraceInfo,_std::allocator<testing::internal::TraceInfo>_>_>
  ::~ThreadLocal(&this->gtest_trace_stack_);
  pDVar3 = (this->death_test_factory_).ptr_;
  if (pDVar3 != (DeathTestFactory *)0x0) {
    (*pDVar3->_vptr_DeathTestFactory[1])();
    (this->death_test_factory_).ptr_ = (DeathTestFactory *)0x0;
  }
  scoped_ptr<testing::internal::InternalRunDeathTestFlag>::reset
            (&this->internal_run_death_test_flag_,(InternalRunDeathTestFlag *)0x0);
  TestEventListeners::~TestEventListeners(&this->listeners_);
  TestResult::~TestResult(&this->ad_hoc_test_result_);
  ParameterizedTestCaseRegistry::~ParameterizedTestCaseRegistry(&this->parameterized_test_registry_)
  ;
  piVar4 = (this->test_case_indices_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (piVar4 != (pointer)0x0) {
    operator_delete(piVar4);
  }
  ppTVar6 = (this->test_cases_).
            super__Vector_base<testing::TestCase_*,_std::allocator<testing::TestCase_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppTVar6 != (pointer)0x0) {
    operator_delete(ppTVar6);
  }
  ppEVar7 = (this->environments_).
            super__Vector_base<testing::Environment_*,_std::allocator<testing::Environment_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  if (ppEVar7 != (pointer)0x0) {
    operator_delete(ppEVar7);
  }
  ThreadLocal<testing::TestPartResultReporterInterface_*>::~ThreadLocal
            (&this->per_thread_test_part_result_reporter_);
  Mutex::~Mutex(&this->global_test_part_result_reporter_mutex_);
  pcVar5 = (this->original_working_dir_).pathname_._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar5 != &(this->original_working_dir_).pathname_.field_2) {
    operator_delete(pcVar5);
    return;
  }
  return;
}

Assistant:

UnitTestImpl::~UnitTestImpl() {
  // Deletes every TestCase.
  ForEach(test_cases_, internal::Delete<TestCase>);

  // Deletes every Environment.
  ForEach(environments_, internal::Delete<Environment>);

  delete os_stack_trace_getter_;
}